

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall QHostInfoLookupManager::rescheduleWithMutexHeld(QHostInfoLookupManager *this)

{
  const_iterator aend;
  const_iterator aend_00;
  const_iterator aend_01;
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  iterator iVar4;
  int *piVar5;
  QList<QHostInfoRunnable_*> *this_00;
  Promoted<int,_long_long> PVar6;
  QHostInfoRunnable **ppQVar7;
  iterator o;
  int iVar8;
  back_insert_iterator<QList<QHostInfoRunnable_*>_> in_RDI;
  long in_FS_OFFSET;
  int readyToStartCount;
  int i;
  iterator it;
  int availableThreads;
  anon_class_8_1_8991fb9c isAlreadyRunning;
  parameter_type in_stack_fffffffffffffe88;
  qsizetype *in_stack_fffffffffffffe90;
  QList<QHostInfoRunnable_*> *in_stack_fffffffffffffeb0;
  anon_class_8_1_8991fb9c in_stack_fffffffffffffeb8;
  front_insert_iterator<QQueue<QHostInfoRunnable_*>_> in_stack_fffffffffffffec0;
  iterator in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  const_iterator in_stack_fffffffffffffee8;
  int local_b4;
  const_iterator local_a0;
  const_iterator local_98;
  iterator local_90;
  qsizetype local_88;
  int local_7c;
  int local_78;
  int local_74;
  const_iterator local_70;
  QHostInfoRunnable **local_68;
  pair<std::back_insert_iterator<QList<QHostInfoRunnable_*>_>,_QList<QHostInfoRunnable_*>::iterator>
  local_60;
  QHostInfoRunnable **local_50;
  const_iterator local_48;
  const_iterator local_40;
  QHostInfoRunnable **local_38;
  pair<QList<QHostInfoRunnable_*>::iterator,_std::front_insert_iterator<QQueue<QHostInfoRunnable_*>_>_>
  local_30;
  QHostInfoRunnable **local_20;
  const_iterator local_18;
  QHostInfoRunnable **local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)*(QHostInfoRunnable **)((long)in_RDI.container + 0xe8) & 1) == 0) {
    bVar1 = QList<QHostInfoRunnable_*>::isEmpty((QList<QHostInfoRunnable_*> *)0x21e780);
    if (!bVar1) {
      local_b4 = 0;
      while( true ) {
        in_stack_fffffffffffffec0.container = (QQueue<QHostInfoRunnable_*> *)(long)local_b4;
        qVar3 = QList<QHostInfoRunnable_*>::size
                          ((QList<QHostInfoRunnable_*> *)((long)in_RDI.container + 0xa0));
        if (qVar3 <= (long)in_stack_fffffffffffffec0.container) break;
        in_stack_fffffffffffffeb8.this = (QHostInfoLookupManager *)((long)in_RDI.container + 0xb8);
        QList<QHostInfoRunnable_*>::at
                  ((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90,
                   (qsizetype)in_stack_fffffffffffffe88);
        QList<int>::removeAll<int>
                  ((QList<int> *)in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
        local_b4 = local_b4 + 1;
      }
      QList<QHostInfoRunnable_*>::clear((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
    }
    local_10 = (QHostInfoRunnable **)in_RDI.container;
    QList<QHostInfoRunnable_*>::begin((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
    QList<QHostInfoRunnable_*>::end((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
    QList<QHostInfoRunnable_*>::begin((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
    std::front_inserter<QQueue<QHostInfoRunnable*>>
              ((QQueue<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
    local_38 = local_10;
    local_30 = (anonymous_namespace)::
               separate_if<QList<QHostInfoRunnable*>::iterator,QList<QHostInfoRunnable*>::iterator,std::front_insert_iterator<QQueue<QHostInfoRunnable*>>,QHostInfoLookupManager::rescheduleWithMutexHeld()::__0>
                         (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                          (iterator)in_RDI.container,in_stack_fffffffffffffec0,
                          in_stack_fffffffffffffeb8);
    local_20 = local_30.first.i;
    QList<QHostInfoRunnable_*>::const_iterator::const_iterator(&local_18,local_30.first);
    iVar4 = QList<QHostInfoRunnable_*>::end((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90)
    ;
    QList<QHostInfoRunnable_*>::const_iterator::const_iterator(&local_40,iVar4);
    aend.i._4_4_ = in_stack_fffffffffffffee4;
    aend.i._0_4_ = in_stack_fffffffffffffee0;
    QList<QHostInfoRunnable_*>::erase(in_stack_fffffffffffffeb0,in_stack_fffffffffffffee8,aend);
    QList<QHostInfoRunnable_*>::begin((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
    QList<QHostInfoRunnable_*>::end((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
    std::back_inserter<QList<QHostInfoRunnable*>>
              ((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
    QList<QHostInfoRunnable_*>::begin((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
    local_68 = local_10;
    local_60 = (anonymous_namespace)::
               separate_if<QList<QHostInfoRunnable*>::iterator,std::back_insert_iterator<QList<QHostInfoRunnable*>>,QList<QHostInfoRunnable*>::iterator,QHostInfoLookupManager::rescheduleWithMutexHeld()::__0>
                         (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_RDI,
                          (iterator)in_stack_fffffffffffffec0.container,in_stack_fffffffffffffeb8);
    local_50 = local_60.second.i;
    QList<QHostInfoRunnable_*>::const_iterator::const_iterator(&local_48,local_60.second);
    iVar4 = QList<QHostInfoRunnable_*>::end((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90)
    ;
    QList<QHostInfoRunnable_*>::const_iterator::const_iterator(&local_70,iVar4);
    aend_00.i._4_4_ = in_stack_fffffffffffffee4;
    aend_00.i._0_4_ = in_stack_fffffffffffffee0;
    iVar4 = QList<QHostInfoRunnable_*>::erase
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffee8,aend_00);
    local_78 = QThreadPool::maxThreadCount();
    local_7c = 1;
    piVar5 = std::max<int>(&local_78,&local_7c);
    this_00 = (QList<QHostInfoRunnable_*> *)(long)*piVar5;
    qVar3 = QList<QHostInfoRunnable_*>::size
                      ((QList<QHostInfoRunnable_*> *)&in_RDI.container[3].d.size);
    local_74 = (int)this_00 - (int)qVar3;
    if (0 < local_74) {
      local_88 = QList<QHostInfoRunnable_*>::size
                           ((QList<QHostInfoRunnable_*> *)&in_RDI.container[5].d.size);
      PVar6 = qMin<int,long_long>(&local_74,&local_88);
      iVar2 = (int)PVar6;
      local_90.i = (QHostInfoRunnable **)0xaaaaaaaaaaaaaaaa;
      local_90 = QList<QHostInfoRunnable_*>::begin
                           ((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90);
      while (iVar8 = iVar2 + -1, iVar2 != 0) {
        in_stack_fffffffffffffe90 = &in_RDI.container[8].d.size;
        ppQVar7 = QList<QHostInfoRunnable_*>::iterator::operator*(&local_90);
        QThreadPool::start((QRunnable *)in_stack_fffffffffffffe90,(int)*ppQVar7);
        QList<QHostInfoRunnable_*>::iterator::operator*(&local_90);
        QList<QHostInfoRunnable_*>::push_back
                  ((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88
                  );
        QList<QHostInfoRunnable_*>::iterator::operator++(&local_90);
        iVar2 = iVar8;
      }
      o = QList<QHostInfoRunnable_*>::begin((QList<QHostInfoRunnable_*> *)in_stack_fffffffffffffe90)
      ;
      QList<QHostInfoRunnable_*>::const_iterator::const_iterator(&local_98,o);
      QList<QHostInfoRunnable_*>::const_iterator::const_iterator(&local_a0,local_90);
      aend_01.i._4_4_ = iVar8;
      aend_01.i._0_4_ = in_stack_fffffffffffffee0;
      QList<QHostInfoRunnable_*>::erase(this_00,(const_iterator)iVar4.i,aend_01);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostInfoLookupManager::rescheduleWithMutexHeld()
{
    if (wasDeleted)
        return;

    // goals of this function:
    //  - launch new lookups via the thread pool
    //  - make sure only one lookup per host/IP is in progress

    if (!finishedLookups.isEmpty()) {
        // remove ID from aborted if it is in there
        for (int i = 0; i < finishedLookups.size(); i++) {
           abortedLookups.removeAll(finishedLookups.at(i)->id);
        }

        finishedLookups.clear();
    }

#if QT_CONFIG(thread)
    auto isAlreadyRunning = [this](QHostInfoRunnable *lookup) {
        return std::any_of(currentLookups.cbegin(), currentLookups.cend(), ToBeLookedUpEquals(lookup->toBeLookedUp));
    };

    // Transfer any postponed lookups that aren't currently running to the scheduled list, keeping already-running lookups:
    postponedLookups.erase(separate_if(postponedLookups.begin(),
                                       postponedLookups.end(),
                                       postponedLookups.begin(),
                                       std::front_inserter(scheduledLookups), // prepend! we want to finish it ASAP
                                       isAlreadyRunning).first,
                           postponedLookups.end());

    // Unschedule and postpone any that are currently running:
    scheduledLookups.erase(separate_if(scheduledLookups.begin(),
                                       scheduledLookups.end(),
                                       std::back_inserter(postponedLookups),
                                       scheduledLookups.begin(),
                                       isAlreadyRunning).second,
                           scheduledLookups.end());

    const int availableThreads = std::max(threadPool.maxThreadCount(), 1) - currentLookups.size();
    if (availableThreads > 0) {
        int readyToStartCount = qMin(availableThreads, scheduledLookups.size());
        auto it = scheduledLookups.begin();
        while (readyToStartCount--) {
            // runnable now running in new thread, track this in currentLookups
            threadPool.start(*it);
            currentLookups.push_back(std::move(*it));
            ++it;
        }
        scheduledLookups.erase(scheduledLookups.begin(), it);
    }
#else
    if (!scheduledLookups.isEmpty())
        scheduledLookups.takeFirst()->run();
#endif
}